

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O3

int __thiscall QProcessEnvironment::remove(QProcessEnvironment *this,char *__filename)

{
  QProcessEnvironmentPrivate *this_00;
  long in_FS_OFFSET;
  Key local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d).d.ptr != (QProcessEnvironmentPrivate *)0x0) {
    QSharedDataPointer<QProcessEnvironmentPrivate>::detach(&this->d);
    this_00 = (this->d).d.ptr;
    QProcessEnvironmentPrivate::prepareName(&local_38,this_00,(QString *)__filename);
    QMap<QByteArray,_QProcEnvValue>::remove(&this_00->vars,(char *)&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QProcessEnvironment::remove(const QString &name)
{
    if (d.constData()) {
        QProcessEnvironmentPrivate *p = d.data();
        p->vars.remove(p->prepareName(name));
    }
}